

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O1

void __thiscall
Js::FunctionCodeGenRuntimeData::SetupRecursiveInlineeChain
          (FunctionCodeGenRuntimeData *this,Recycler *recycler,ProfileId profiledCallSiteId,
          FunctionBody *inlinee)

{
  Type *addr;
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Recycler *this_00;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar6;
  size_t size;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x46,"(recycler)","recycler");
    if (!bVar3) goto LAB_00980c9e;
    *puVar5 = 0;
  }
  if (((this->functionBody).ptr)->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x47,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar3) goto LAB_00980c9e;
    *puVar5 = 0;
  }
  if ((this->functionBody).ptr != inlinee) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x48,"(inlinee == functionBody)","inlinee == functionBody");
    if (!bVar3) goto LAB_00980c9e;
    *puVar5 = 0;
  }
  if ((this->inlinees).ptr == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    data.plusSize = (size_t)((this->functionBody).ptr)->profiledCallSiteCount;
    local_58 = (undefined1  [8])&Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_4af85b2;
    data.filename._0_4_ = 0x4b;
    this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
    uVar1 = ((this->functionBody).ptr)->profiledCallSiteCount;
    if (uVar1 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      pWVar6 = (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)&DAT_00000008;
    }
    else {
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00980c9e;
        *puVar5 = 0;
      }
      size = (ulong)uVar1 << 3;
      pWVar6 = (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)
               Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                         (this_00,size);
      if (pWVar6 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_00980c9e:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      memset(pWVar6,0,size);
    }
    addr = &this->inlinees;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pWVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  pWVar6 = (this->inlinees).ptr + profiledCallSiteId;
  Memory::Recycler::WBSetBit((char *)pWVar6);
  pWVar6->ptr = this;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar6);
  return;
}

Assistant:

void FunctionCodeGenRuntimeData::SetupRecursiveInlineeChain(
        Recycler *const recycler,
        const ProfileId profiledCallSiteId,
        FunctionBody *const inlinee)
    {
        Assert(recycler);
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());
        Assert(inlinee == functionBody);
        if (!inlinees)
        {
            inlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenRuntimeData*), functionBody->GetProfiledCallSiteCount());
        }
        inlinees[profiledCallSiteId] = this;
    }